

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

bool __thiscall
libcellml::Variable::VariableImpl::hasIndirectEquivalentVariable
          (VariableImpl *this,VariablePtr *equivalentVariable)

{
  Variable *variable2;
  bool bVar1;
  vector<const_libcellml::Variable_*,_std::allocator<const_libcellml::Variable_*>_> testedVariables;
  _Vector_base<const_libcellml::Variable_*,_std::allocator<const_libcellml::Variable_*>_> local_28;
  
  variable2 = (equivalentVariable->
              super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (this->mVariable == variable2) {
    bVar1 = false;
  }
  else {
    local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = haveEquivalentVariables
                      (this->mVariable,variable2,
                       (vector<const_libcellml::Variable_*,_std::allocator<const_libcellml::Variable_*>_>
                        *)&local_28);
    std::_Vector_base<const_libcellml::Variable_*,_std::allocator<const_libcellml::Variable_*>_>::
    ~_Vector_base(&local_28);
  }
  return bVar1;
}

Assistant:

bool Variable::VariableImpl::hasIndirectEquivalentVariable(const VariablePtr &equivalentVariable) const
{
    if (mVariable == equivalentVariable.get()) {
        return false;
    }

    std::vector<const Variable *> testedVariables;

    return haveEquivalentVariables(mVariable, equivalentVariable.get(), testedVariables);
}